

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-stats.cc
# Opt level: O0

Result __thiscall wabt::anon_unknown_23::BinaryReaderOpcnt::OnEndExpr(BinaryReaderOpcnt *this)

{
  Result RVar1;
  Kind local_20;
  Enum local_1c;
  BinaryReaderOpcnt *local_18;
  BinaryReaderOpcnt *this_local;
  
  local_1c = End;
  local_20 = Bare;
  local_18 = this;
  RVar1 = (anonymous_namespace)::BinaryReaderOpcnt::
          Emplace<wabt::Opcode::Enum,wabt::OpcodeInfo::Kind>
                    ((BinaryReaderOpcnt *)this,&local_1c,&local_20);
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderOpcnt::OnEndExpr() {
  return Emplace(Opcode::End, OpcodeInfo::Kind::Bare);
}